

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

bool __thiscall TPZStructMatrixOR<double>::ThreadData::ShouldCompute(ThreadData *this,int matid)

{
  bool bVar1;
  
  bVar1 = ::TPZStructMatrix::ShouldCompute((TPZStructMatrix *)this,matid);
  return bVar1;
}

Assistant:

bool 
TPZStructMatrixOR<TVar>::ThreadData::ShouldCompute(int matid) const{
    return fStruct->ShouldCompute(matid);
}